

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

void Aig_SupportNodes(Aig_Man_t *p,Aig_Obj_t **ppObjs,int nObjs,Vec_Ptr_t *vSupp)

{
  Aig_Obj_t *pObj;
  ulong uVar1;
  
  vSupp->nSize = 0;
  Aig_ManIncrementTravId(p);
  p->pConst1->TravId = p->nTravIds;
  if (0 < nObjs) {
    uVar1 = 0;
    do {
      pObj = ppObjs[uVar1];
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(ppObjs[i])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                      ,0x35e,"void Aig_SupportNodes(Aig_Man_t *, Aig_Obj_t **, int, Vec_Ptr_t *)");
      }
      if ((*(uint *)&pObj->field_0x18 & 7) == 3) {
        pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      }
      Aig_Support_rec(p,pObj,vSupp);
      uVar1 = uVar1 + 1;
    } while ((uint)nObjs != uVar1);
  }
  return;
}

Assistant:

void Aig_SupportNodes( Aig_Man_t * p, Aig_Obj_t ** ppObjs, int nObjs, Vec_Ptr_t * vSupp )
{
    int i;
    Vec_PtrClear( vSupp );
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    for ( i = 0; i < nObjs; i++ )
    {
        assert( !Aig_IsComplement(ppObjs[i]) );
        if ( Aig_ObjIsCo(ppObjs[i]) )
            Aig_Support_rec( p, Aig_ObjFanin0(ppObjs[i]), vSupp );
        else
            Aig_Support_rec( p, ppObjs[i], vSupp );
    }
}